

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_arith_encode_log2(stb_arith *a,uint totalfreq2,uint freq,uint cumfreq)

{
  uint uVar1;
  uint uVar2;
  uint old;
  uint range;
  uint cumfreq_local;
  uint freq_local;
  uint totalfreq2_local;
  stb_arith *a_local;
  
  uVar1 = a->range_low;
  uVar2 = a->range_high - a->range_low >> ((byte)totalfreq2 & 0x1f);
  a->range_low = uVar2 * cumfreq + a->range_low;
  a->range_high = a->range_low + uVar2 * freq;
  if (a->range_low < uVar1) {
    stb__arith_carry(a);
  }
  while (a->range_high - a->range_low < 0x1000000) {
    stb__renorm_encoder(a);
  }
  return;
}

Assistant:

void stb_arith_encode_log2(stb_arith *a, unsigned int totalfreq2, unsigned int freq, unsigned int cumfreq)
{
   unsigned int range = a->range_high - a->range_low;
   unsigned int old = a->range_low;
   range >>= totalfreq2;
   a->range_low += range * cumfreq;
   a->range_high = a->range_low + range*freq;
   if (a->range_low < old)
      stb__arith_carry(a);
   while (a->range_high - a->range_low < 0x1000000)
      stb__renorm_encoder(a);
}